

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpData.cpp
# Opt level: O0

void __thiscall HttpData::seperateTimer(HttpData *this)

{
  bool bVar1;
  TimerNode *in_RDI;
  shared_ptr<TimerNode> my_timer;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffcc;
  __weak_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffffd0;
  __shared_ptr local_18 [24];
  
  std::weak_ptr<TimerNode>::lock
            ((weak_ptr<TimerNode> *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_18);
  uVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffc8);
  std::shared_ptr<TimerNode>::~shared_ptr((shared_ptr<TimerNode> *)0x110d9c);
  if ((uVar2 & 0x1000000) != 0) {
    std::weak_ptr<TimerNode>::lock((weak_ptr<TimerNode> *)CONCAT44(in_stack_ffffffffffffffcc,uVar2))
    ;
    std::__shared_ptr_access<TimerNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<TimerNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x110dc9)
    ;
    TimerNode::clearReq(in_RDI);
    std::__weak_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>::reset(in_stack_ffffffffffffffd0);
    std::shared_ptr<TimerNode>::~shared_ptr((shared_ptr<TimerNode> *)0x110dee);
  }
  return;
}

Assistant:

void HttpData::seperateTimer() {
  // cout << "seperateTimer" << endl;
  if (timer_.lock()) {
    shared_ptr<TimerNode> my_timer(timer_.lock());
    my_timer->clearReq();
    timer_.reset();
  }
}